

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

bool __thiscall GrcSymbolTableEntry::IsReadOnlySlotAttr(GrcSymbolTableEntry *this)

{
  bool bVar1;
  GrcSymbolTableEntry *in_RDI;
  bool local_ba;
  string *in_stack_ffffffffffffff48;
  allocator *staField;
  int in_stack_ffffffffffffff54;
  uint i;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"position",&local_31);
  bVar1 = FieldIs(in_RDI,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
  i = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((i & 0x1000000) == 0) {
    staField = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"collision",staField);
    bVar1 = FieldIs(in_RDI,i,(string *)staField);
    local_ba = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"fix",&local_91);
      local_ba = FieldIs(in_RDI,i,(string *)staField);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (local_ba == false) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GrcSymbolTableEntry::IsReadOnlySlotAttr()
{
	Assert(FitsSymbolType(ksymtSlotAttr));

	if (FieldIs(0, "position"))
		return true;
	else if (FieldIs(0, "collision") && FieldIs(1, "fix"))
		return true;
	else
		return false;
}